

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

void allocate_winner_mode_stats(AV1_COMP *cpi,macroblock *mb)

{
  int iVar1;
  void *pvVar2;
  long in_RSI;
  AV1_COMP *in_RDI;
  int winner_mode_count;
  AV1_COMMON *cm;
  SPEED_FEATURES *sf;
  
  iVar1 = is_stat_generation_stage(in_RDI);
  if ((iVar1 == 0) &&
     ((((in_RDI->sf).rt_sf.use_nonrd_pick_mode == 0 ||
       ((in_RDI->sf).rt_sf.hybrid_intra_pickmode != 0)) &&
      ((in_RDI->sf).winner_mode_sf.multi_winner_mode_type != '\0')))) {
    pvVar2 = aom_malloc(0x25a7e9);
    *(void **)(in_RSI + 0x1c630) = pvVar2;
    if (*(long *)(in_RSI + 0x1c630) == 0) {
      aom_internal_error((in_RDI->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate mb->winner_mode_stats");
    }
  }
  return;
}

Assistant:

static inline void allocate_winner_mode_stats(const AV1_COMP *cpi,
                                              struct macroblock *mb) {
  const SPEED_FEATURES *sf = &cpi->sf;
  // The winner_mode_stats buffer is not required in these cases.
  if (is_stat_generation_stage(cpi) ||
      (sf->rt_sf.use_nonrd_pick_mode && !sf->rt_sf.hybrid_intra_pickmode) ||
      (sf->winner_mode_sf.multi_winner_mode_type == MULTI_WINNER_MODE_OFF))
    return;

  const AV1_COMMON *cm = &cpi->common;
  const int winner_mode_count =
      winner_mode_count_allowed[sf->winner_mode_sf.multi_winner_mode_type];
  CHECK_MEM_ERROR(cm, mb->winner_mode_stats,
                  (WinnerModeStats *)aom_malloc(
                      winner_mode_count * sizeof(mb->winner_mode_stats[0])));
}